

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_lha.c
# Opt level: O2

wchar_t lzh_make_fake_table(huffman_conflict *hf,uint16_t c)

{
  bool bVar1;
  undefined2 in_register_00000032;
  
  bVar1 = CONCAT22(in_register_00000032,c) < hf->len_size;
  if (bVar1) {
    *hf->tbl = c;
    hf->max_bits = L'\0';
    hf->shift_bits = L'\0';
    hf->bitlen[c] = '\0';
  }
  return (uint)bVar1;
}

Assistant:

static int
lzh_make_fake_table(struct huffman *hf, uint16_t c)
{
	if (c >= hf->len_size)
		return (0);
	hf->tbl[0] = c;
	hf->max_bits = 0;
	hf->shift_bits = 0;
	hf->bitlen[hf->tbl[0]] = 0;
	return (1);
}